

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

uint8 * __thiscall
caffe::EmbedParameter::InternalSerializeWithCachedSizesToArray
          (EmbedParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  bool value;
  uint32 uVar2;
  UnknownFieldSet *unknown_fields;
  uint8 *puStack_40;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  EmbedParameter *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  puStack_40 = target;
  if ((uVar1 & 4) != 0) {
    uVar2 = num_output(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(1,uVar2,target);
  }
  if ((uVar1 & 8) != 0) {
    uVar2 = input_dim(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(2,uVar2,puStack_40);
  }
  if ((uVar1 & 0x10) != 0) {
    value = bias_term(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteBoolToArray(3,value,puStack_40);
  }
  if ((uVar1 & 1) != 0) {
    puStack_40 = google::protobuf::internal::WireFormatLite::
                 InternalWriteMessageNoVirtualToArray<caffe::FillerParameter>
                           (4,this->weight_filler_,deterministic,puStack_40);
  }
  if ((uVar1 & 2) != 0) {
    puStack_40 = google::protobuf::internal::WireFormatLite::
                 InternalWriteMessageNoVirtualToArray<caffe::FillerParameter>
                           (5,this->bias_filler_,deterministic,puStack_40);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = EmbedParameter::unknown_fields(this);
    puStack_40 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                           (unknown_fields,puStack_40);
  }
  return puStack_40;
}

Assistant:

::google::protobuf::uint8* EmbedParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.EmbedParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional uint32 num_output = 1;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(1, this->num_output(), target);
  }

  // optional uint32 input_dim = 2;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(2, this->input_dim(), target);
  }

  // optional bool bias_term = 3 [default = true];
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(3, this->bias_term(), target);
  }

  // optional .caffe.FillerParameter weight_filler = 4;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        4, *this->weight_filler_, deterministic, target);
  }

  // optional .caffe.FillerParameter bias_filler = 5;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        5, *this->bias_filler_, deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.EmbedParameter)
  return target;
}